

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  _Rb_tree_header *p_Var1;
  pointer pFVar2;
  pointer pLVar3;
  FuncDesc *pFVar4;
  Offset OVar5;
  Result RVar6;
  Enum EVar7;
  uint index_00;
  Location loc;
  undefined1 local_68 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_58;
  pointer local_48;
  anon_union_4_2_59e55c6f_for_HandlerDesc_4 local_40;
  u32 local_3c;
  u32 local_38;
  
  pFVar2 = (this->module_->funcs).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  index_00 = index - ((int)((ulong)((long)(this->func_types_).
                                          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->func_types_).
                                         super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6) +
                     (int)((ulong)((long)(this->module_->funcs).
                                         super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2)
                          >> 3) * 0x11111111);
  this->func_ = pFVar2 + index_00;
  OVar5 = Istream::end(this->istream_);
  this->func_->code_offset = OVar5;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&this->depth_fixups_,
             (_Link_type)
             (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->depth_fixups_).map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar3) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar3;
  }
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index_00);
  local_58._8_8_ = (ulong)(uint)local_58._12_4_ << 0x20;
  local_68._0_8_ = (this->filename_)._M_len;
  local_68._8_8_ = (this->filename_)._M_str;
  local_58.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar6 = SharedValidator::BeginFunctionBody(&this->validator_,(Location *)local_68,index);
  EVar7 = Error;
  if (RVar6.enum_ != Error) {
    PushLabel(this,Try,0xffffffff,0xffffffff,
              (int)((ulong)((long)(this->func_->handlers).
                                  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->func_->handlers).
                                 super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
    pFVar4 = this->func_;
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    OVar5 = Istream::end(this->istream_);
    local_68._4_4_ = OVar5;
    local_68._8_4_ = 0xffffffff;
    local_58.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    local_58._8_8_ = 0;
    local_48 = (pointer)0x0;
    local_40.catch_all_offset = 0xffffffff;
    local_3c = (u32)((ulong)((long)(this->func_->locals).
                                   super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->func_->locals).
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
    local_38 = 0;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
    emplace_back<wabt::interp::HandlerDesc>(&pFVar4->handlers,(HandlerDesc *)local_68);
    EVar7 = Ok;
    if (local_58.field_1.offset != 0) {
      operator_delete((void *)local_58.field_1.offset,(long)local_48 - local_58._0_8_);
      EVar7 = Ok;
    }
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(GetLocation(), index));

  // Push implicit func label (equivalent to return).
  // With exception handling it acts as a catch-less try block, which is
  // needed to support delegating to the caller of a function using the
  // try-delegate instruction.
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        static_cast<u32>(func_->locals.size()),
                                        0});
  return Result::Ok;
}